

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# symmetric_matrix.cc
# Opt level: O2

void __thiscall
sptk::SymmetricMatrix::SymmetricMatrix(SymmetricMatrix *this,SymmetricMatrix *matrix)

{
  int iVar1;
  int i;
  long lVar2;
  int j;
  uint uVar3;
  allocator_type local_19;
  
  this->_vptr_SymmetricMatrix = (_func_int **)&PTR__SymmetricMatrix_00118d60;
  this->num_dimension_ = matrix->num_dimension_;
  std::vector<double,_std::allocator<double>_>::vector(&this->data_,&matrix->data_);
  std::vector<double_*,_std::allocator<double_*>_>::vector
            (&this->index_,(long)this->num_dimension_,&local_19);
  iVar1 = this->num_dimension_;
  lVar2 = 0;
  uVar3 = 0;
  while (lVar2 < iVar1) {
    (this->index_).super__Vector_base<double_*,_std::allocator<double_*>_>._M_impl.
    super__Vector_impl_data._M_start[lVar2] =
         (this->data_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
         super__Vector_impl_data._M_start + uVar3;
    lVar2 = lVar2 + 1;
    uVar3 = uVar3 + (int)lVar2;
  }
  return;
}

Assistant:

SymmetricMatrix::SymmetricMatrix(const SymmetricMatrix& matrix)
    : num_dimension_(matrix.num_dimension_),
      data_(matrix.data_),
      index_(num_dimension_) {
  for (int i(0), j(0); i < num_dimension_; ++i, j += i) {
    index_[i] = &data_[j];
  }
}